

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O2

void run_test(void)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  socklen_t *__addr_len;
  char *__s;
  bool bVar5;
  undefined1 auStack_41970 [8];
  automaton a;
  char buffer [2000];
  sockaddr local_504 [62];
  undefined1 local_118 [8];
  char boolstr [2] [100];
  char expected_ans_tmp [10];
  _Bool local_31 [8];
  _Bool err;
  
  local_31[0] = false;
  load_automaton((automaton *)auStack_41970,local_31);
  expected_ans_tmp[2] = '\0';
  expected_ans_tmp[3] = '\0';
  expected_ans_tmp[4] = '\0';
  expected_ans_tmp[5] = '\0';
  expected_ans_tmp[6] = '\0';
  expected_ans_tmp[7] = '\0';
  expected_ans_tmp[8] = '\0';
  expected_ans_tmp[9] = '\0';
  while( true ) {
    __s = a.transitions[0xa41] + 0x5d;
    pcVar3 = fgets(__s,2000,_stdin);
    if (pcVar3 == (char *)0x0) break;
    sVar4 = strlen(__s);
    __s[sVar4 - 1] = '\0';
    pcVar3 = fgets(boolstr[1] + 0x62,10,_stdin);
    cVar1 = boolstr[1][0x62];
    local_31[0] = pcVar3 == (char *)0x0;
    bVar5 = boolstr[1][0x62] != '0';
    getpid();
    memset(local_504,0,0x3e9);
    sVar4 = strlen(__s);
    memcpy(local_504,__s,sVar4);
    printf("Validating processed word: %s\n",local_504);
    uVar2 = accept((int)auStack_41970,local_504,__addr_len);
    if (bVar5 == (bool)(char)uVar2) {
      printf("PASSED: %s\n",local_504);
    }
    else {
      expected_ans_tmp._2_8_ = expected_ans_tmp._2_8_ + 1;
      printf("FAILED TEST: %s - ",local_504);
      memcpy(local_118,"false",200);
      printf("got %s instead of %s. \n",boolstr[((ulong)uVar2 & 0xff) - 1] + 0x5c,
             boolstr[(ulong)(cVar1 != '0') - 1] + 0x5c);
    }
    putchar(10);
    a.transitions[0xa41][0x5d] = '\0';
  }
  printf("Finished, # of failed cases: %zu.\n",expected_ans_tmp._2_8_);
  return;
}

Assistant:

void run_test() {
    automaton a;
    size_t failed = 0;
    bool err = false;
    void *tmp_err;
    load_automaton(&a, &err);

    char buffer[2*WORD_LEN_MAX]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin)) {
        assert(strlen(buffer) < WORD_LEN_MAX +2);
        assert(buffer[strlen(buffer)-1] == '\n');
        buffer[strlen(buffer)-1] = '\0';

        // load answer for loaded word
        char expected_ans_tmp[10];
        tmp_err = fgets(expected_ans_tmp, 10, stdin);
        err = (tmp_err == NULL);
        bool expected_ans = (bool)(expected_ans_tmp[0]-'0');
        assert(expected_ans==true || expected_ans == false);

        // testing if validator mq holds enough data
        validator_mq_msg test_msg = {false, false, false, true, false, getpid(), ""};
        memcpy(test_msg.word, buffer, strlen(buffer));
        printf("Validating processed word: %s\n", test_msg.word);

        // testing validation result
        bool ans = accept(&a, test_msg.word);
        if(ans != expected_ans) {
            failed++;
            printf("FAILED TEST: %s - ", test_msg.word);
            char boolstr[2][100] = {"false", "true"};
            printf("got %s instead of %s. \n", boolstr[ans], boolstr[expected_ans]);
        } else {
            printf("PASSED: %s\n", test_msg.word);
        }
        printf("\n");
        buffer[0] = '\0';
    }
    printf("Finished, # of failed cases: %zu.\n", failed);
}